

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall wabt::anon_unknown_4::Validator::CheckModule(Validator *this)

{
  SharedValidator *pSVar1;
  Location *pLVar2;
  int iVar3;
  Module *pMVar4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  long lVar7;
  ModuleField *pMVar8;
  Enum *pEVar9;
  string_view name;
  TypeMut TVar10;
  size_type sVar11;
  Result RVar12;
  ArrayType *array_type;
  Index func_index;
  TypeMut field_00;
  Field *field_1;
  _func_int *p_Var13;
  ModuleField *pMVar14;
  Var *pVVar15;
  ModuleField *field;
  ModuleField *pMVar16;
  ModuleField *field_4;
  Enum *pEVar17;
  TypeMutVector type_muts;
  TypeMut local_430;
  undefined1 local_428 [32];
  pointer local_408;
  undefined8 local_3f0;
  Var local_3d8;
  Var local_390;
  Var local_348;
  Var local_300;
  Var local_2b8;
  Var local_270;
  Var local_228;
  Var local_1e0;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  pMVar4 = this->current_module_;
  pMVar14 = (pMVar4->fields).first_;
  if (pMVar14 != (ModuleField *)0x0) {
    pSVar1 = &this->validator_;
    do {
      if (pMVar14->type_ == Type) {
        pp_Var5 = pMVar14[1]._vptr_ModuleField;
        iVar3 = *(int *)(pp_Var5 + 9);
        if (iVar3 == 2) {
          field_00._5_3_ = 0;
          field_00._0_5_ = *(uint5 *)(pp_Var5 + 0xe);
          RVar12 = SharedValidator::OnArrayType(pSVar1,&pMVar14->loc,field_00);
LAB_00155398:
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        }
        else if (iVar3 == 1) {
          local_428._0_8_ = (TypeMut *)0x0;
          local_428._8_8_ = (TypeMut *)0x0;
          local_428._16_8_ = 0;
          p_Var6 = pp_Var5[0xb];
          for (p_Var13 = pp_Var5[10]; p_Var13 != p_Var6; p_Var13 = p_Var13 + 0x28) {
            local_430.type.enum_ = *(Enum *)(p_Var13 + 0x20);
            local_430.mutable_ = (bool)p_Var13[0x24];
            if (local_428._8_8_ == local_428._16_8_) {
              std::vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_>::
              _M_realloc_insert<wabt::TypeMut>
                        ((vector<wabt::TypeMut,_std::allocator<wabt::TypeMut>_> *)local_428,
                         (iterator)local_428._8_8_,&local_430);
            }
            else {
              TVar10.mutable_ = (bool)p_Var13[0x24];
              TVar10._5_3_ = local_430._5_3_;
              TVar10.type.enum_ = local_430.type.enum_;
              *(TypeMut *)local_428._8_8_ = TVar10;
              local_428._8_8_ = local_428._8_8_ + 8;
            }
          }
          RVar12 = SharedValidator::OnStructType
                             (pSVar1,&pMVar14->loc,
                              (Index)((ulong)(local_428._8_8_ - local_428._0_8_) >> 3),
                              (TypeMut *)local_428._0_8_);
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          if ((TypeMut *)local_428._0_8_ != (TypeMut *)0x0) {
            operator_delete((void *)local_428._0_8_);
          }
        }
        else if (iVar3 == 0) {
          RVar12 = SharedValidator::OnFuncType
                             (pSVar1,&pMVar14->loc,
                              (Index)((ulong)((long)pp_Var5[0xb] - (long)pp_Var5[10]) >> 2),
                              (Type *)pp_Var5[10],
                              (Index)((ulong)((long)pp_Var5[0xe] - (long)pp_Var5[0xd]) >> 2),
                              (Type *)pp_Var5[0xd]);
          goto LAB_00155398;
        }
      }
      pMVar14 = (pMVar14->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar14 != (ModuleField *)0x0);
  }
  pMVar14 = (pMVar4->fields).first_;
  if (pMVar14 != (ModuleField *)0x0) {
    pSVar1 = &this->validator_;
    do {
      if (pMVar14->type_ != Import) goto switchD_001553fe_default;
      pp_Var5 = pMVar14[1]._vptr_ModuleField;
      switch(*(undefined4 *)(pp_Var5 + 9)) {
      case 0:
        pVVar15 = &local_78;
        GetFuncTypeIndex(pVVar15,this,&pMVar14->loc,(FuncDeclaration *)(pp_Var5 + 0xe));
        RVar12 = SharedValidator::OnFunction(pSVar1,&pMVar14->loc,pVVar15);
        goto LAB_0015545a;
      case 1:
        RVar12 = SharedValidator::OnTable
                           (pSVar1,&pMVar14->loc,(Type)*(Enum *)(pp_Var5 + 0x11),
                            (Limits *)(pp_Var5 + 0xe));
        break;
      case 2:
        RVar12 = SharedValidator::OnMemory(pSVar1,&pMVar14->loc,(Limits *)(pp_Var5 + 0xe));
        break;
      case 3:
        RVar12 = SharedValidator::OnGlobalImport
                           (pSVar1,&pMVar14->loc,(Type)*(Enum *)(pp_Var5 + 0xe),
                            *(bool *)((long)pp_Var5 + 0x74));
        break;
      case 4:
        pVVar15 = &local_c0;
        GetFuncTypeIndex(pVVar15,this,&pMVar14->loc,(FuncDeclaration *)(pp_Var5 + 0xe));
        RVar12 = SharedValidator::OnEvent(pSVar1,&pMVar14->loc,pVVar15);
LAB_0015545a:
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(pVVar15);
      default:
        goto switchD_001553fe_default;
      }
      (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
switchD_001553fe_default:
      pMVar14 = (pMVar14->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar14 != (ModuleField *)0x0);
  }
  pMVar14 = (pMVar4->fields).first_;
  if (pMVar14 != (ModuleField *)0x0) {
    do {
      if (pMVar14->type_ == Func) {
        GetFuncTypeIndex(&local_108,this,&pMVar14->loc,
                         (FuncDeclaration *)&pMVar14[1].loc.filename.size_);
        RVar12 = SharedValidator::OnFunction(&this->validator_,&pMVar14->loc,&local_108);
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_108);
      }
      pMVar14 = (pMVar14->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar14 != (ModuleField *)0x0);
  }
  pMVar14 = (pMVar4->fields).first_;
  if (pMVar14 != (ModuleField *)0x0) {
    do {
      if (pMVar14->type_ == Table) {
        RVar12 = SharedValidator::OnTable
                           (&this->validator_,&pMVar14->loc,(Type)pMVar14[1].type_,
                            (Limits *)&pMVar14[1].loc.filename.size_);
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
      }
      pMVar14 = (pMVar14->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar14 != (ModuleField *)0x0);
  }
  pMVar14 = (pMVar4->fields).first_;
  if (pMVar14 != (ModuleField *)0x0) {
    do {
      if (pMVar14->type_ == Memory) {
        RVar12 = SharedValidator::OnMemory
                           (&this->validator_,&pMVar14->loc,(Limits *)&pMVar14[1].loc.filename.size_
                           );
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
      }
      pMVar14 = (pMVar14->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar14 != (ModuleField *)0x0);
  }
  pMVar14 = (pMVar4->fields).first_;
  if (pMVar14 != (ModuleField *)0x0) {
    pSVar1 = &this->validator_;
    do {
      if (pMVar14->type_ == Global) {
        RVar12 = SharedValidator::OnGlobal
                           (pSVar1,&pMVar14->loc,(Type)(Enum)pMVar14[1].loc.filename.size_,
                            *(bool *)((long)&pMVar14[1].loc.filename.size_ + 4));
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        if (*(long *)&pMVar14[1].type_ == 1) {
          lVar7 = *(long *)&pMVar14[1].loc.field_1;
          iVar3 = *(int *)(lVar7 + 0x38);
          if (iVar3 < 0x22) {
            if (iVar3 == 0xf) {
              RVar12 = SharedValidator::OnGlobalInitExpr_Const
                                 (pSVar1,(Location *)(lVar7 + 0x18),(Type)*(Enum *)(lVar7 + 0x60));
              goto LAB_00155706;
            }
            if (iVar3 != 0x12) goto LAB_001556fb;
            if (*(int *)(lVar7 + 0x38) != 0x12) goto LAB_00155dd2;
            pVVar15 = (Var *)local_428;
            Var::Var(pVVar15,(Var *)(lVar7 + 0x40));
            Var::Var(&local_150,pVVar15);
            RVar12 = SharedValidator::OnGlobalInitExpr_GlobalGet
                               (pSVar1,(Location *)(lVar7 + 0x18),&local_150);
            (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
            Var::~Var(&local_150);
          }
          else {
            if (iVar3 != 0x22) {
              if (iVar3 != 0x23) goto LAB_001556fb;
              RVar12 = SharedValidator::OnGlobalInitExpr_RefNull(pSVar1,(Location *)(lVar7 + 0x18));
              goto LAB_00155706;
            }
            pVVar15 = &local_198;
            Var::Var(pVVar15,(Var *)(lVar7 + 0x40));
            RVar12 = SharedValidator::OnGlobalInitExpr_RefFunc
                               (pSVar1,(Location *)(lVar7 + 0x18),pVVar15);
            (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          }
          Var::~Var(pVVar15);
        }
        else {
LAB_001556fb:
          RVar12 = SharedValidator::OnGlobalInitExpr_Other(pSVar1,&pMVar14->loc);
LAB_00155706:
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        }
      }
      pMVar14 = (pMVar14->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar14 != (ModuleField *)0x0);
  }
  pMVar14 = (pMVar4->fields).first_;
  if (pMVar14 != (ModuleField *)0x0) {
    do {
      if (pMVar14->type_ == Event) {
        GetFuncTypeIndex(&local_1e0,this,&pMVar14->loc,
                         (FuncDeclaration *)&pMVar14[1].loc.filename.size_);
        RVar12 = SharedValidator::OnEvent(&this->validator_,&pMVar14->loc,&local_1e0);
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_1e0);
      }
      pMVar14 = (pMVar14->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar14 != (ModuleField *)0x0);
  }
  pMVar14 = (pMVar4->fields).first_;
  if (pMVar14 != (ModuleField *)0x0) {
    do {
      if (pMVar14->type_ == Export) {
        sVar11 = pMVar14[1].loc.filename.size_;
        Var::Var(&local_228,(Var *)&pMVar14[1].loc.field_1.field_0);
        name.data_ = (char *)pMVar14[1]._vptr_ModuleField;
        name.size_ = (size_type)pMVar14[1].super_intrusive_list_base<wabt::ModuleField>.next_;
        RVar12 = SharedValidator::OnExport
                           (&this->validator_,&pMVar14->loc,(ExternalKind)sVar11,&local_228,name);
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_228);
      }
      pMVar14 = (pMVar14->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar14 != (ModuleField *)0x0);
  }
  pMVar14 = (pMVar4->fields).first_;
  if (pMVar14 != (ModuleField *)0x0) {
    do {
      if (pMVar14->type_ == Start) {
        Var::Var(&local_270,(Var *)(pMVar14 + 1));
        RVar12 = SharedValidator::OnStart(&this->validator_,&pMVar14->loc,&local_270);
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_270);
      }
      pMVar14 = (pMVar14->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar14 != (ModuleField *)0x0);
  }
  pMVar14 = (pMVar4->fields).first_;
  if (pMVar14 != (ModuleField *)0x0) {
    pSVar1 = &this->validator_;
    do {
      if (pMVar14->type_ == ElemSegment) {
        pLVar2 = &pMVar14->loc;
        Var::Var(&local_2b8,(Var *)&pMVar14[1].loc.field_1.field_0);
        RVar12 = SharedValidator::OnElemSegment
                           (pSVar1,pLVar2,&local_2b8,*(SegmentKind *)&pMVar14[1]._vptr_ModuleField);
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_2b8);
        SharedValidator::OnElemSegmentElemType
                  (pSVar1,(Type)pMVar14[2].loc.field_1.field_0.last_column);
        pMVar16 = pMVar14[3].super_intrusive_list_base<wabt::ModuleField>.next_;
        if (pMVar16 != (ModuleField *)0x0) {
          if (pMVar16 == (ModuleField *)0x1) {
            lVar7 = *(long *)&pMVar14[2].type_;
            if (*(int *)(lVar7 + 0x38) == 0x12) {
              if (*(int *)(lVar7 + 0x38) == 0x12) {
                Var::Var((Var *)local_428,(Var *)(lVar7 + 0x40));
                Var::Var(&local_300,(Var *)local_428);
                RVar12 = SharedValidator::OnElemSegmentInitExpr_GlobalGet
                                   (pSVar1,(Location *)(lVar7 + 0x18),&local_300);
                (this->result_).enum_ =
                     (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
                Var::~Var(&local_300);
                Var::~Var((Var *)local_428);
                goto LAB_001559da;
              }
              goto LAB_00155dd2;
            }
            if (*(int *)(lVar7 + 0x38) != 0xf) goto LAB_001559b0;
            RVar12 = SharedValidator::OnElemSegmentInitExpr_Const
                               (pSVar1,(Location *)(lVar7 + 0x18),(Type)*(Enum *)(lVar7 + 0x60));
          }
          else {
LAB_001559b0:
            RVar12 = SharedValidator::OnElemSegmentInitExpr_Other(pSVar1,pLVar2);
          }
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        }
LAB_001559da:
        pMVar8 = (ModuleField *)pMVar14[3].loc.filename.data_;
        for (pMVar16 = pMVar14[3].super_intrusive_list_base<wabt::ModuleField>.prev_;
            pMVar16 != pMVar8;
            pMVar16 = (ModuleField *)&pMVar16[1].super_intrusive_list_base<wabt::ModuleField>.prev_)
        {
          if (*(int *)&pMVar16->_vptr_ModuleField == 1) {
            Var::Var(&local_348,(Var *)&pMVar16->super_intrusive_list_base<wabt::ModuleField>);
            RVar12 = SharedValidator::OnElemSegmentElemExpr_RefFunc
                               (pSVar1,(Location *)
                                       &pMVar16->super_intrusive_list_base<wabt::ModuleField>,
                                &local_348);
            (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
            Var::~Var(&local_348);
          }
          else if (*(int *)&pMVar16->_vptr_ModuleField == 0) {
            RVar12 = SharedValidator::OnElemSegmentElemExpr_RefNull(pSVar1,pLVar2);
            (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
          }
        }
      }
      pMVar14 = (pMVar14->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar14 != (ModuleField *)0x0);
  }
  pSVar1 = &this->validator_;
  SharedValidator::OnDataCount
            (pSVar1,(Index)((ulong)((long)(pMVar4->data_segments).
                                          super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(pMVar4->data_segments).
                                         super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3));
  pMVar14 = (pMVar4->fields).first_;
  if (pMVar14 != (ModuleField *)0x0) {
    func_index = pMVar4->num_func_imports;
    do {
      if (pMVar14->type_ == Func) {
        pLVar2 = &pMVar14->loc;
        RVar12 = SharedValidator::BeginFunctionBody(pSVar1,pLVar2,func_index);
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        pEVar9 = (Enum *)pMVar14[3].loc.field_1.field_1.offset;
        for (pEVar17 = (Enum *)pMVar14[3].loc.filename.size_; pEVar17 != pEVar9;
            pEVar17 = pEVar17 + 2) {
          RVar12 = SharedValidator::OnLocalDecl(pSVar1,pLVar2,pEVar17[1],(Type)*pEVar17);
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        }
        ExprVisitor::ExprVisitor((ExprVisitor *)local_428,&this->super_Delegate);
        RVar12 = ExprVisitor::VisitExprList
                           ((ExprVisitor *)local_428,(ExprList *)((long)&pMVar14[4].loc.field_1 + 8)
                           );
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        RVar12 = SharedValidator::EndFunctionBody(pSVar1,pLVar2);
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        if ((void *)local_3f0 != (void *)0x0) {
          operator_delete((void *)local_3f0);
        }
        if (local_408 != (pointer)0x0) {
          operator_delete(local_408);
        }
        if ((TypeMut *)local_428._8_8_ != (TypeMut *)0x0) {
          operator_delete((void *)local_428._8_8_);
        }
        func_index = func_index + 1;
      }
      pMVar14 = (pMVar14->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar14 != (ModuleField *)0x0);
  }
  pMVar14 = (pMVar4->fields).first_;
  if (pMVar14 != (ModuleField *)0x0) {
    do {
      if (pMVar14->type_ == DataSegment) {
        Var::Var(&local_390,(Var *)&pMVar14[1].loc.field_1.field_0);
        RVar12 = SharedValidator::OnDataSegment
                           (pSVar1,&pMVar14->loc,&local_390,
                            *(SegmentKind *)&pMVar14[1]._vptr_ModuleField);
        (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        Var::~Var(&local_390);
        if (pMVar14[3]._vptr_ModuleField != (_func_int **)0x0) {
          if (pMVar14[3]._vptr_ModuleField == (_func_int **)0x1) {
            lVar7 = *(long *)((long)&pMVar14[2].loc.field_1 + 8);
            if (*(int *)(lVar7 + 0x38) == 0x12) {
              if (*(int *)(lVar7 + 0x38) != 0x12) {
LAB_00155dd2:
                __assert_fail("isa<Derived>(base)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h"
                              ,0x48,
                              "const Derived *wabt::cast(const Base *) [Derived = wabt::VarExpr<wabt::ExprType::GlobalGet>, Base = wabt::Expr]"
                             );
              }
              Var::Var((Var *)local_428,(Var *)(lVar7 + 0x40));
              Var::Var(&local_3d8,(Var *)local_428);
              RVar12 = SharedValidator::OnDataSegmentInitExpr_GlobalGet
                                 (pSVar1,(Location *)(lVar7 + 0x18),&local_3d8);
              (this->result_).enum_ =
                   (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
              Var::~Var(&local_3d8);
              Var::~Var((Var *)local_428);
              goto LAB_00155d20;
            }
            if (*(int *)(lVar7 + 0x38) != 0xf) goto LAB_00155cfa;
            RVar12 = SharedValidator::OnDataSegmentInitExpr_Const
                               (pSVar1,(Location *)(lVar7 + 0x18),(Type)*(Enum *)(lVar7 + 0x60));
          }
          else {
LAB_00155cfa:
            RVar12 = SharedValidator::OnDataSegmentInitExpr_Other(pSVar1,&pMVar14->loc);
          }
          (this->result_).enum_ = (uint)(RVar12.enum_ == Error || (this->result_).enum_ == Error);
        }
      }
LAB_00155d20:
      pMVar14 = (pMVar14->super_intrusive_list_base<wabt::ModuleField>).next_;
    } while (pMVar14 != (ModuleField *)0x0);
  }
  RVar12 = SharedValidator::EndModule(pSVar1);
  RVar12.enum_._0_1_ = RVar12.enum_ == Error || (this->result_).enum_ == Error;
  RVar12.enum_._1_3_ = 0;
  (this->result_).enum_ = RVar12.enum_;
  return (Result)RVar12.enum_;
}

Assistant:

Result Validator::CheckModule() {
  const Module* module = current_module_;

  // Type section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TypeModuleField>(&field)) {
      switch (f->type->kind()) {
        case TypeEntryKind::Func: {
          FuncType* func_type = cast<FuncType>(f->type.get());
          result_ |= validator_.OnFuncType(field.loc,
                                           func_type->sig.param_types.size(),
                                           func_type->sig.param_types.data(),
                                           func_type->sig.result_types.size(),
                                           func_type->sig.result_types.data());
          break;
        }

        case TypeEntryKind::Struct: {
          StructType* struct_type = cast<StructType>(f->type.get());
          TypeMutVector type_muts;
          for (auto&& field : struct_type->fields) {
            type_muts.push_back(TypeMut{field.type, field.mutable_});
          }
          result_ |= validator_.OnStructType(field.loc, type_muts.size(),
                                             type_muts.data());
          break;
        }

        case TypeEntryKind::Array: {
          ArrayType* array_type = cast<ArrayType>(f->type.get());
          result_ |= validator_.OnArrayType(
              field.loc,
              TypeMut{array_type->field.type, array_type->field.mutable_});
          break;
        }
      }
    }
  }

  // Import section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ImportModuleField>(&field)) {
      switch (f->import->kind()) {
        case ExternalKind::Func: {
          auto&& func = cast<FuncImport>(f->import.get())->func;
          result_ |= validator_.OnFunction(
              field.loc, GetFuncTypeIndex(field.loc, func.decl));
          break;
        }

        case ExternalKind::Table: {
          auto&& table = cast<TableImport>(f->import.get())->table;
          result_ |=
              validator_.OnTable(field.loc, table.elem_type, table.elem_limits);
          break;
        }

        case ExternalKind::Memory: {
          auto&& memory = cast<MemoryImport>(f->import.get())->memory;
          result_ |= validator_.OnMemory(field.loc, memory.page_limits);
          break;
        }

        case ExternalKind::Global: {
          auto&& global = cast<GlobalImport>(f->import.get())->global;
          result_ |= validator_.OnGlobalImport(field.loc, global.type,
                                               global.mutable_);
          break;
        }

        case ExternalKind::Event: {
          auto&& event = cast<EventImport>(f->import.get())->event;
          result_ |= validator_.OnEvent(
              field.loc, GetFuncTypeIndex(field.loc, event.decl));
          break;
        }
      }
    }
  }

  // Func section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      result_ |= validator_.OnFunction(
          field.loc, GetFuncTypeIndex(field.loc, f->func.decl));
    }
  }

  // Table section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<TableModuleField>(&field)) {
      result_ |= validator_.OnTable(field.loc, f->table.elem_type,
                                    f->table.elem_limits);
    }
  }

  // Memory section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<MemoryModuleField>(&field)) {
      result_ |= validator_.OnMemory(field.loc, f->memory.page_limits);
    }
  }

  // Global section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<GlobalModuleField>(&field)) {
      result_ |=
          validator_.OnGlobal(field.loc, f->global.type, f->global.mutable_);

      if (f->global.init_expr.size() == 1) {
        const Expr* expr = &f->global.init_expr.front();

        switch (expr->type()) {
          case ExprType::Const:
            result_ |= validator_.OnGlobalInitExpr_Const(
                expr->loc, cast<ConstExpr>(expr)->const_.type());
            break;

          case ExprType::GlobalGet: {
            Var var = cast<GlobalGetExpr>(expr)->var;
            result_ |= validator_.OnGlobalInitExpr_GlobalGet(expr->loc, var);
            break;
          }

          case ExprType::RefFunc:
            result_ |= validator_.OnGlobalInitExpr_RefFunc(
                expr->loc, cast<RefFuncExpr>(expr)->var);
            break;

          case ExprType::RefNull:
            result_ |= validator_.OnGlobalInitExpr_RefNull(expr->loc);
            break;

          default:
            result_ |= validator_.OnGlobalInitExpr_Other(field.loc);
            break;
        }
      } else {
        result_ |= validator_.OnGlobalInitExpr_Other(field.loc);
      }
    }
  }

  // Event section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<EventModuleField>(&field)) {
      result_ |= validator_.OnEvent(field.loc,
                                    GetFuncTypeIndex(field.loc, f->event.decl));
    }
  }

  // Export section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ExportModuleField>(&field)) {
      result_ |= validator_.OnExport(field.loc, f->export_.kind, f->export_.var,
                                     f->export_.name);
    }
  }

  // Start section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<StartModuleField>(&field)) {
      result_ |= validator_.OnStart(field.loc, f->start);
    }
  }

  // Elem segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<ElemSegmentModuleField>(&field)) {
      result_ |= validator_.OnElemSegment(field.loc, f->elem_segment.table_var,
                                          f->elem_segment.kind);

      validator_.OnElemSegmentElemType(f->elem_segment.elem_type);

      // Init expr.
      if (f->elem_segment.offset.size() == 1) {
        const Expr* expr = &f->elem_segment.offset.front();

        switch (expr->type()) {
          case ExprType::Const:
            result_ |= validator_.OnElemSegmentInitExpr_Const(
                expr->loc, cast<ConstExpr>(expr)->const_.type());
            break;

          case ExprType::GlobalGet: {
            Var var = cast<GlobalGetExpr>(expr)->var;
            result_ |=
                validator_.OnElemSegmentInitExpr_GlobalGet(expr->loc, var);
            break;
          }

          default:
            result_ |= validator_.OnElemSegmentInitExpr_Other(field.loc);
            break;
        }
      } else if (f->elem_segment.offset.size() > 1) {
        result_ |= validator_.OnElemSegmentInitExpr_Other(field.loc);
      }

      // Element expr.
      for (auto&& elem_expr : f->elem_segment.elem_exprs) {
        switch (elem_expr.kind) {
          case ElemExprKind::RefNull:
            // TODO: better location?
            result_ |= validator_.OnElemSegmentElemExpr_RefNull(field.loc);
            break;

          case ElemExprKind::RefFunc:
            result_ |= validator_.OnElemSegmentElemExpr_RefFunc(
                elem_expr.var.loc, elem_expr.var);
            break;
        }
      }
    }
  }

  // DataCount section.
  validator_.OnDataCount(module->data_segments.size());

  // Code section.
  Index func_index = module->num_func_imports;
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<FuncModuleField>(&field)) {
      result_ |= validator_.BeginFunctionBody(field.loc, func_index++);

      for (auto&& decl : f->func.local_types.decls()) {
        // TODO: Better location?
        result_ |= validator_.OnLocalDecl(field.loc, decl.second, decl.first);
      }

      ExprVisitor visitor(this);
      result_ |= visitor.VisitExprList(const_cast<ExprList&>(f->func.exprs));
      result_ |= validator_.EndFunctionBody(field.loc);
    }
  }

  // Data segment section.
  for (const ModuleField& field : module->fields) {
    if (auto* f = dyn_cast<DataSegmentModuleField>(&field)) {
      result_ |= validator_.OnDataSegment(
          field.loc, f->data_segment.memory_var, f->data_segment.kind);

      // Init expr.
      if (f->data_segment.offset.size() == 1) {
        const Expr* expr = &f->data_segment.offset.front();

        switch (expr->type()) {
          case ExprType::Const:
            result_ |= validator_.OnDataSegmentInitExpr_Const(
                expr->loc, cast<ConstExpr>(expr)->const_.type());
            break;

          case ExprType::GlobalGet: {
            Var var = cast<GlobalGetExpr>(expr)->var;
            result_ |=
                validator_.OnDataSegmentInitExpr_GlobalGet(expr->loc, var);
            break;
          }

          default:
            result_ |= validator_.OnDataSegmentInitExpr_Other(field.loc);
            break;
        }
      } else if (f->data_segment.offset.size() > 1) {
        result_ |= validator_.OnDataSegmentInitExpr_Other(field.loc);
      }
    }
  }

  result_ |= validator_.EndModule();

  return result_;
}